

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void deleteMissingFiles(Options *options,QDir *srcDir,QDir *dstDir)

{
  long lVar1;
  int *piVar2;
  FILE *pFVar3;
  byte bVar4;
  char cVar5;
  char16_t *pcVar6;
  long lVar7;
  bool bVar8;
  QFileInfo *src;
  undefined8 *puVar9;
  long lVar10;
  long in_FS_OFFSET;
  QStringView QVar11;
  QStringView QVar12;
  QArrayData *local_d8;
  longlong local_d0;
  QArrayData *local_c0;
  undefined8 *local_b8;
  QString local_a8;
  QString local_90;
  QArrayDataPointer<QFileInfo> local_78;
  QArrayDataPointer<QFileInfo> local_58;
  long local_38;
  
  pFVar3 = _stdout;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (options->verbose == true) {
    QDir::absolutePath();
    QString::toLocal8Bit_helper((QChar *)&local_58,CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_));
    puVar9 = (undefined8 *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    if (puVar9 == (undefined8 *)0x0) {
      puVar9 = &QByteArray::_empty;
    }
    QDir::absolutePath();
    QString::toLocal8Bit_helper((QChar *)&local_90,(longlong)local_a8.d.ptr);
    pcVar6 = local_90.d.ptr;
    if (local_90.d.ptr == (storage_type *)0x0) {
      pcVar6 = (char16_t *)&QByteArray::_empty;
    }
    fprintf(pFVar3,"Delete missing files %s %s\n",puVar9,pcVar6);
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar2 = (int *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_),1,0x10);
      }
    }
    piVar2 = (int *)CONCAT44(local_78.d._4_4_,local_78.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_78.d._4_4_,local_78.d._0_4_),2,0x10);
      }
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  QDir::entryInfoList(&local_58,srcDir,0x6003,0xffffffff);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d._0_4_ = 0xaaaaaaaa;
  local_78.d._4_4_ = 0xaaaaaaaa;
  local_78.ptr._0_4_ = 0xaaaaaaaa;
  local_78.ptr._4_4_ = 0xaaaaaaaa;
  QDir::entryInfoList(&local_78,dstDir,0x6003,0xffffffff);
  if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
    lVar10 = CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_);
    lVar1 = lVar10 + local_78.size * 8;
    do {
      if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
LAB_0010d0c1:
        pFVar3 = _stdout;
        if (options->verbose == true) {
          QFileInfo::fileName();
          QString::toLocal8Bit_helper((QChar *)&local_90,(longlong)local_a8.d.ptr);
          pcVar6 = local_90.d.ptr;
          if (local_90.d.ptr == (storage_type *)0x0) {
            pcVar6 = (char16_t *)&QByteArray::_empty;
          }
          QDir::absolutePath();
          QString::toLocal8Bit_helper((QChar *)&local_c0,local_d0);
          puVar9 = local_b8;
          if (local_b8 == (undefined8 *)0x0) {
            puVar9 = &QByteArray::_empty;
          }
          fprintf(pFVar3,"%s not found in %s, removing it.\n",pcVar6,puVar9);
          if (local_c0 != (QArrayData *)0x0) {
            LOCK();
            (local_c0->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_c0,1,0x10);
            }
          }
          if (local_d8 != (QArrayData *)0x0) {
            LOCK();
            (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_d8,2,0x10);
            }
          }
          if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        cVar5 = QFileInfo::isDir();
        if (cVar5 == '\0') {
          QFileInfo::absoluteFilePath();
          QFile::remove(&local_90);
        }
        else {
          QFileInfo::absolutePath();
          QDir::QDir((QDir *)&local_a8,&local_90);
          QDir::removeRecursively();
          QDir::~QDir((QDir *)&local_a8);
        }
        if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        lVar7 = local_58.size * 8;
        bVar8 = false;
        do {
          lVar7 = lVar7 + -8;
          QFileInfo::fileName();
          QFileInfo::fileName();
          if (local_90.d.size == local_a8.d.size) {
            QVar11.m_data = local_90.d.ptr;
            QVar11.m_size = local_90.d.size;
            QVar12.m_data = local_a8.d.ptr;
            QVar12.m_size = local_a8.d.size;
            bVar4 = QtPrivate::equalStrings(QVar11,QVar12);
          }
          else {
            bVar4 = 0;
          }
          if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (bVar4 != 0) {
            cVar5 = QFileInfo::isDir();
            bVar8 = true;
            if (cVar5 != '\0') {
              QFileInfo::absoluteFilePath();
              QDir::QDir((QDir *)&local_c0,&local_90);
              QFileInfo::absoluteFilePath();
              QDir::QDir((QDir *)&local_d8,&local_a8);
              deleteMissingFiles(options,(QDir *)&local_c0,(QDir *)&local_d8);
              QDir::~QDir((QDir *)&local_d8);
              if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
                }
              }
              QDir::~QDir((QDir *)&local_c0);
              if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
                }
              }
              bVar8 = true;
            }
          }
        } while ((bVar4 | lVar7 == 0) != 1);
        if (!bVar8) goto LAB_0010d0c1;
      }
      lVar10 = lVar10 + 8;
    } while (lVar10 != lVar1);
  }
  fflush(_stdout);
  QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void deleteMissingFiles(const Options &options, const QDir &srcDir, const QDir &dstDir)
{
    if (options.verbose)
        fprintf(stdout, "Delete missing files %s %s\n", qPrintable(srcDir.absolutePath()), qPrintable(dstDir.absolutePath()));

    const QFileInfoList srcEntries = srcDir.entryInfoList(QDir::NoDotAndDotDot | QDir::Files | QDir::Dirs);
    const QFileInfoList dstEntries = dstDir.entryInfoList(QDir::NoDotAndDotDot | QDir::Files | QDir::Dirs);
    for (const QFileInfo &dst : dstEntries) {
        bool found = false;
        for (const QFileInfo &src : srcEntries)
            if (dst.fileName() == src.fileName()) {
                if (dst.isDir())
                    deleteMissingFiles(options, src.absoluteFilePath(), dst.absoluteFilePath());
                found = true;
                break;
            }

        if (!found) {
            if (options.verbose)
                fprintf(stdout, "%s not found in %s, removing it.\n", qPrintable(dst.fileName()), qPrintable(srcDir.absolutePath()));

            if (dst.isDir())
                QDir{dst.absolutePath()}.removeRecursively();
            else
                QFile::remove(dst.absoluteFilePath());
        }
    }
    fflush(stdout);
}